

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

void hash_check_collision(adh_weight_t weight,int hash_index,adh_node_t *node)

{
  hash_entry_t *phVar1;
  ulong uVar2;
  
  if (node->weight == weight) {
    return;
  }
  uVar2 = 0;
  for (phVar1 = map_weight_nodes.buckets[hash_index]; phVar1 != (hash_entry_t *)0x0;
      phVar1 = phVar1->next) {
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  log_info("hash_check_collision","collision, size:%d w1:%d w2:%d\n",uVar2,(ulong)weight);
  return;
}

Assistant:

void hash_check_collision(adh_weight_t weight, int hash_index, const adh_node_t *node) {
    if(node->weight != weight) {
        int size = 0;
        hash_entry_t* he = map_weight_nodes.buckets[hash_index];
        while(he != NULL) {
            size++;
            he = he->next;
        }
        log_info("hash_check_collision", "collision, size:%d w1:%d w2:%d\n", size, weight, node->weight);
    }
}